

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall
r_comp::Compiler::getGlobalReferenceIndex
          (Compiler *this,string *reference_name,ReturnType t,ImageObject *object,uint16_t *index,
          Class **_class)

{
  bool bVar1;
  undefined8 in_RAX;
  iterator iVar2;
  size_t i;
  uint *puVar3;
  int iVar4;
  ulong uVar5;
  iterator __position;
  uint16_t uVar6;
  int iVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_metadata->global_references)._M_h,reference_name);
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
       ._M_cur == (__node_type *)0x0) ||
     ((t != ANY &&
      (*(ReturnType *)
        ((long)iVar2.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
               ._M_cur + 0x70) != t)))) {
    bVar1 = false;
  }
  else {
    *_class = (Class *)((long)iVar2.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
                              ._M_cur + 0x30);
    puVar3 = *(uint **)(object + 0x28);
    if (puVar3 == *(uint **)(object + 0x20)) {
      uVar5 = *(ulong *)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
                               ._M_cur + 0x28);
      __position._M_current = puVar3;
    }
    else {
      i = 0;
      uVar6 = 0;
      do {
        puVar3 = r_code::vector<unsigned_int>::operator[]((vector<unsigned_int> *)(object + 0x20),i)
        ;
        uVar5 = *(ulong *)((long)iVar2.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
                                 ._M_cur + 0x28);
        if (uVar5 == *puVar3) goto LAB_00126845;
        uVar6 = uVar6 + 1;
        i = (size_t)uVar6;
        puVar3 = *(uint **)(object + 0x20);
        __position._M_current = *(uint **)(object + 0x28);
      } while (i < (ulong)((long)__position._M_current - (long)puVar3 >> 2));
    }
    iVar4 = (int)puVar3;
    uStack_38 = CONCAT44((uint)uVar5,(undefined4)uStack_38);
    if (__position._M_current == *(uint **)(object + 0x30)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)(object + 0x20),__position,
                 (uint *)((long)&uStack_38 + 4));
      iVar4 = (int)*(undefined8 *)(object + 0x20);
      iVar7 = (int)*(undefined8 *)(object + 0x28);
    }
    else {
      *__position._M_current = (uint)uVar5;
      *(uint **)(object + 0x28) = __position._M_current + 1;
      iVar7 = (int)(__position._M_current + 1);
    }
    uVar6 = (short)((uint)(iVar7 - iVar4) >> 2) - 1;
LAB_00126845:
    *index = uVar6;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Compiler::getGlobalReferenceIndex(const std::string reference_name, const ReturnType t, ImageObject *object, uint16_t &index, Class *&_class)
{
    std::unordered_map<std::string, Reference>::iterator it = _metadata->global_references.find(reference_name);

    if (it != _metadata->global_references.end() && (t == ANY || (t != ANY && it->second._class.type == t))) {
        _class = &it->second._class;

        for (uint16_t j = 0; j < object->references.size(); ++j)
            if (object->references[j] == it->second.index) { // the object has already been referenced.
                index = j; // rptr points to object->reference_set[j], which in turn points to it->second.index.
                return true;
            }

        object->references.push_back(it->second.index); // add new reference to the object.
        index = object->references.size() - 1; // rptr points to the last element of object->reference_set, which in turn points to it->second.index.
        return true;
    }

    return false;
}